

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_writer_fragmentation.c
# Opt level: O0

void test_frag_80_3(void)

{
  int iVar1;
  
  cunit_start_test("test_frag_80_3");
  tlvcount = 3;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x50;
  iVar1 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar1 == 0,"test_frag_80_3",0xce,"Parser should return 0");
  rfc5444_writer_flush(&writer,&small_if,0);
  rfc5444_writer_flush(&writer,&large_if,0);
  cunit_named_check(fragments == 3,"test_frag_80_3",0xd2,"bad number of fragments: %d\n",
                    (ulong)(uint)fragments);
  cunit_named_check(packets[0] == 3,"test_frag_80_3",0xd3,"bad number of packets on if 1: %d\n",
                    (ulong)(uint)packets[0]);
  cunit_named_check(packets[1] == 2,"test_frag_80_3",0xd4,"bad number of packets on if 2: %d\n",
                    (ulong)(uint)packets[1]);
  cunit_end_test("test_frag_80_3");
  return;
}

Assistant:

static void test_frag_80_3(void) {
  START_TEST();

  tlvcount = 3;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 80;

  CHECK_TRUE(0 == rfc5444_writer_create_message_alltarget(&writer, 1, 4), "Parser should return 0");
  rfc5444_writer_flush(&writer, &small_if, false);
  rfc5444_writer_flush(&writer, &large_if, false);

  CHECK_TRUE(fragments == 3, "bad number of fragments: %d\n", fragments);
  CHECK_TRUE(packets[0] == 3, "bad number of packets on if 1: %d\n", packets[0]);
  CHECK_TRUE(packets[1] == 2, "bad number of packets on if 2: %d\n", packets[1]);

  END_TEST();
}